

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O3

SyntaxNode * __thiscall
slang::syntax::SyntaxRewriter<InterleavedRewriter>::parse
          (SyntaxRewriter<InterleavedRewriter> *this,string_view text)

{
  string_view name;
  string_view text_00;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays;
  shared_ptr<slang::syntax::SyntaxTree> local_58;
  undefined8 local_48;
  char *pcStack_40;
  _Alloc_hider local_38;
  size_type local_30;
  undefined8 local_28;
  undefined8 local_20;
  pointer local_18;
  pointer ppStack_10;
  
  text_00._M_str = (char *)text._M_len;
  local_48 = 0;
  pcStack_40 = "";
  local_38._M_p = (pointer)0x3f;
  local_30 = 1;
  local_20 = 0;
  local_28 = &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  local_18 = (pointer)0x0;
  ppStack_10 = (pointer)0x0;
  name._M_str = (char *)0x6;
  name._M_len = (size_t)this->sourceManager;
  text_00._M_len = (size_t)&local_58;
  SyntaxTree::fromText
            (text_00,(SourceManager *)text._M_str,name,(string_view)(ZEXT816(0x9db414) << 0x40),
             (Bag *)0xa0c2b6,(SourceLibrary *)&stack0xffffffffffffffc8);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
  ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
            ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
              *)&this->tempTrees,&local_58);
  if (local_58.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&stack0xffffffffffffffc8);
  return ((this->tempTrees).
          super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         rootNode;
}

Assistant:

SyntaxNode& parse(std::string_view text) {
        tempTrees.emplace_back(SyntaxTree::fromText(text, *sourceManager));
        return tempTrees.back()->root();
    }